

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

bool __thiscall irr::video::COpenGLDriver::endScene(COpenGLDriver *this)

{
  byte bVar1;
  long in_RDI;
  bool status;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  bool bVar2;
  
  CNullDriver::endScene
            ((CNullDriver *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  glFlush();
  bVar2 = false;
  if (*(long *)(in_RDI + 0x10f0) != 0) {
    bVar1 = (**(code **)(**(long **)(in_RDI + 0x10f0) + 0x48))();
    bVar2 = (bool)(bVar1 & 1);
  }
  return bVar2;
}

Assistant:

bool COpenGLDriver::endScene()
{
	CNullDriver::endScene();

	glFlush();

	bool status = false;

	if (ContextManager)
		status = ContextManager->swapBuffers();

	// todo: console device present

	return status;
}